

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
clique_t::clique_t(clique_t *this,vector<long,_std::allocator<long>_> *_vertices,index_t _loc)

{
  index_t _loc_local;
  vector<long,_std::allocator<long>_> *_vertices_local;
  clique_t *this_local;
  
  std::vector<long,_std::allocator<long>_>::vector(&this->faces);
  std::vector<long,_std::allocator<long>_>::vector(&this->vertices,_vertices);
  this->location = _loc;
  std::
  unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::unordered_map(&this->cofaces);
  return;
}

Assistant:

clique_t(std::vector<index_t> _vertices, index_t _loc)  : vertices(_vertices), location(_loc) {}